

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O1

void VP8InitBitReader(VP8BitReader *br,uint8_t *start,size_t size)

{
  ulong uVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  
  br->range_ = 0xfe;
  br->bits_ = -8;
  br->value_ = 0;
  br->eof_ = 0;
  br->buf_ = start;
  br->buf_end_ = start + size;
  puVar3 = start + (size - 7);
  if (size < 8) {
    puVar3 = start;
  }
  br->buf_max_ = puVar3;
  if (start < puVar3) {
    uVar1 = *(ulong *)start;
    br->buf_ = start + 7;
    br->value_ = ((uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
                  (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
                  (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38) >> 8;
    br->bits_ = 0x30;
    return;
  }
  pbVar2 = br->buf_;
  if (pbVar2 < br->buf_end_) {
    br->bits_ = br->bits_ + 8;
    br->buf_ = pbVar2 + 1;
    br->value_ = br->value_ << 8 | (ulong)*pbVar2;
    return;
  }
  if (br->eof_ != 0) {
    br->bits_ = 0;
    return;
  }
  br->value_ = br->value_ << 8;
  br->bits_ = br->bits_ + 8;
  br->eof_ = 1;
  return;
}

Assistant:

void VP8InitBitReader(VP8BitReader* const br,
                      const uint8_t* const start, size_t size) {
  assert(br != NULL);
  assert(start != NULL);
  assert(size < (1u << 31));   // limit ensured by format and upstream checks
  br->range_   = 255 - 1;
  br->value_   = 0;
  br->bits_    = -8;   // to load the very first 8bits
  br->eof_     = 0;
  VP8BitReaderSetBuffer(br, start, size);
  VP8LoadNewBytes(br);
}